

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O2

void png_set_iCCP(png_const_structrp png_ptr,png_inforp info_ptr,png_const_charp name,
                 int compression_type,png_const_bytep profile,png_uint_32 proflen)

{
  byte *pbVar1;
  undefined4 in_EAX;
  int iVar2;
  size_t sVar3;
  png_charp __dest;
  png_bytep __dest_00;
  char *error_message;
  undefined1 auVar4 [16];
  
  auVar4._0_4_ = -(uint)(png_ptr == (png_const_structrp)0x0);
  auVar4._4_4_ = -(uint)(info_ptr == (png_inforp)0x0);
  auVar4._8_4_ = -(uint)(name == (png_const_charp)0x0);
  auVar4._12_4_ = -(uint)(profile == (png_const_bytep)0x0);
  iVar2 = movmskps(in_EAX,auVar4);
  if (iVar2 != 0) {
    return;
  }
  if (compression_type != 0) {
    png_app_error(png_ptr,"Invalid iCCP compression method");
  }
  sVar3 = strlen(name);
  __dest = (png_charp)png_malloc_warn(png_ptr,sVar3 + 1);
  if (__dest == (png_charp)0x0) {
    error_message = "Insufficient memory to process iCCP chunk";
  }
  else {
    memcpy(__dest,name,sVar3 + 1);
    __dest_00 = (png_bytep)png_malloc_warn(png_ptr,(ulong)proflen);
    if (__dest_00 != (png_bytep)0x0) {
      memcpy(__dest_00,profile,(ulong)proflen);
      png_free_data(png_ptr,info_ptr,0x10,0);
      info_ptr->iccp_proflen = proflen;
      info_ptr->iccp_name = __dest;
      info_ptr->iccp_profile = __dest_00;
      *(byte *)&info_ptr->free_me = (byte)info_ptr->free_me | 0x10;
      pbVar1 = (byte *)((long)&info_ptr->valid + 1);
      *pbVar1 = *pbVar1 | 0x10;
      return;
    }
    png_free(png_ptr,__dest);
    error_message = "Insufficient memory to process iCCP profile";
  }
  png_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void PNGAPI
png_set_iCCP(png_const_structrp png_ptr, png_inforp info_ptr,
    png_const_charp name, int compression_type,
    png_const_bytep profile, png_uint_32 proflen)
{
   png_charp new_iccp_name;
   png_bytep new_iccp_profile;
   size_t length;

   png_debug1(1, "in %s storage function", "iCCP");

   if (png_ptr == NULL || info_ptr == NULL || name == NULL || profile == NULL)
      return;

   if (compression_type != PNG_COMPRESSION_TYPE_BASE)
      png_app_error(png_ptr, "Invalid iCCP compression method");

   length = strlen(name)+1;
   new_iccp_name = png_voidcast(png_charp, png_malloc_warn(png_ptr, length));

   if (new_iccp_name == NULL)
   {
      png_benign_error(png_ptr, "Insufficient memory to process iCCP chunk");

      return;
   }

   memcpy(new_iccp_name, name, length);
   new_iccp_profile = png_voidcast(png_bytep,
       png_malloc_warn(png_ptr, proflen));

   if (new_iccp_profile == NULL)
   {
      png_free(png_ptr, new_iccp_name);
      png_benign_error(png_ptr,
          "Insufficient memory to process iCCP profile");

      return;
   }

   memcpy(new_iccp_profile, profile, proflen);

   png_free_data(png_ptr, info_ptr, PNG_FREE_ICCP, 0);

   info_ptr->iccp_proflen = proflen;
   info_ptr->iccp_name = new_iccp_name;
   info_ptr->iccp_profile = new_iccp_profile;
   info_ptr->free_me |= PNG_FREE_ICCP;
   info_ptr->valid |= PNG_INFO_iCCP;
}